

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImVec4 *__src;
  int iVar4;
  ImVec4 *__dest;
  int iVar5;
  int iVar6;
  undefined7 in_register_00000031;
  uint uVar7;
  float fVar8;
  undefined8 in_XMM0_Qb;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar12._8_8_ = in_XMM0_Qb;
  auVar12._0_8_ = cr_min;
  fVar9 = cr_max.x;
  fVar8 = cr_max.y;
  if ((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) != 0) {
    fVar10 = (this->_CmdHeader).ClipRect.z;
    fVar1 = (this->_CmdHeader).ClipRect.w;
    uVar2 = (this->_CmdHeader).ClipRect.x;
    uVar3 = (this->_CmdHeader).ClipRect.y;
    auVar11._4_4_ = uVar3;
    auVar11._0_4_ = uVar2;
    auVar11._8_8_ = 0;
    auVar12 = maxps(auVar11,auVar12);
    cr_min = auVar12._0_8_;
    if (fVar9 <= fVar10) {
      fVar10 = fVar9;
    }
    fVar9 = fVar10;
    if (fVar1 < fVar8) {
      fVar8 = fVar1;
    }
  }
  iVar4 = (this->_ClipRectStack).Size;
  if (iVar4 == (this->_ClipRectStack).Capacity) {
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    __dest = (ImVec4 *)ImGui::MemAlloc((long)iVar6 << 4);
    __src = (this->_ClipRectStack).Data;
    if (__src != (ImVec4 *)0x0) {
      memcpy(__dest,__src,(long)(this->_ClipRectStack).Size << 4);
      ImGui::MemFree((this->_ClipRectStack).Data);
    }
    (this->_ClipRectStack).Data = __dest;
    (this->_ClipRectStack).Capacity = iVar6;
    iVar4 = (this->_ClipRectStack).Size;
  }
  else {
    __dest = (this->_ClipRectStack).Data;
  }
  uVar7 = -(uint)(fVar8 <= cr_min.y);
  fVar10 = (float)(~uVar7 & (uint)fVar8 | (uint)cr_min.y & uVar7);
  uVar7 = -(uint)(fVar9 <= cr_min.x);
  fVar8 = (float)(~uVar7 & (uint)fVar9 | uVar7 & (uint)cr_min.x);
  __dest[iVar4].x = cr_min.x;
  __dest[iVar4].y = cr_min.y;
  __dest[iVar4].z = fVar8;
  __dest[iVar4].w = fVar10;
  (this->_ClipRectStack).Size = (this->_ClipRectStack).Size + 1;
  (this->_CmdHeader).ClipRect.x = cr_min.x;
  (this->_CmdHeader).ClipRect.y = cr_min.y;
  (this->_CmdHeader).ClipRect.z = fVar8;
  (this->_CmdHeader).ClipRect.w = fVar10;
  _OnChangedClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect)
    {
        ImVec4 current = _CmdHeader.ClipRect;
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    _CmdHeader.ClipRect = cr;
    _OnChangedClipRect();
}